

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pokey.c
# Opt level: O3

UINT8 pokey_read(pokey_device *d,UINT8 offset)

{
  byte bVar1;
  uint uVar2;
  
  bVar1 = 0xff;
  switch(offset & 0xf) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    uVar2 = offset & 7;
    if ((d->m_ALLPOT >> uVar2 & 1) == 0) {
      return d->m_pot_counter;
    }
    bVar1 = d->m_POTx[uVar2];
    break;
  case 8:
    bVar1 = d->m_ALLPOT;
    if ((d->m_SKCTL & 3) != 0) {
      return ~bVar1;
    }
    break;
  case 9:
    return d->m_KBCODE;
  case 10:
    if (-1 < (char)d->m_AUDCTL) {
      return (UINT8)(d->m_poly17[d->m_p17] >> 8);
    }
    return (UINT8)d->m_poly9[d->m_p9];
  case 0xd:
    return d->m_SERIN;
  case 0xe:
    bVar1 = d->m_IRQST;
    goto LAB_00167331;
  case 0xf:
    bVar1 = d->m_SKSTAT;
LAB_00167331:
    return bVar1 ^ 0xff;
  }
  return bVar1;
}

Assistant:

UINT8 pokey_read(pokey_device *d, UINT8 offset)
{
	int data, pot;

	switch (offset & 15)
	{
	case POT0_C: case POT1_C: case POT2_C: case POT3_C:
	case POT4_C: case POT5_C: case POT6_C: case POT7_C:
		pot = offset & 7;
		if (d->m_ALLPOT & (1 << pot))
		{
			/* we have a value measured */
			data = d->m_POTx[pot];
			//LOG("%s: POKEY read POT%d (final value)  $%02x\n", machine().describe_context(), pot, data);
		}
		else
		{
			data = d->m_pot_counter;
			//LOG("%s: POKEY read POT%d (interpolated) $%02x\n", machine().describe_context(), pot, data);
		}
		break;

	case ALLPOT_C:
		/****************************************************************
		 * If the 2 least significant bits of SKCTL are 0, the ALLPOTs
		 * are disabled (SKRESET). Thanks to MikeJ for pointing this out.
		 ****************************************************************/
		if ((d->m_SKCTL & SK_RESET) == 0)
		{
			data = d->m_ALLPOT;
			//LOG("%s: POKEY ALLPOT internal $%02x (reset)\n", machine().describe_context(), data);
		}
		//else if (!d->m_allpot_r_cb.isnull())
		//{
		//	d->m_ALLPOT = data = d->m_allpot_r_cb(offset);
		//	LOG("%s: POKEY ALLPOT callback $%02x\n", machine().describe_context(), data);
		//}
		else
		{
			data = d->m_ALLPOT ^ 0xff;
			//LOG("%s: POKEY ALLPOT internal $%02x\n", machine().describe_context(), data);
		}
		break;

	case KBCODE_C:
		data = d->m_KBCODE;
		break;

	case RANDOM_C:
		if (d->m_AUDCTL & POLY9)
		{
			data = d->m_poly9[d->m_p9] & 0xff;
			//LOG_RAND("%s: POKEY rand9[$%05x]: $%02x\n", machine().describe_context(), m_p9, data);
		}
		else
		{
			data = (d->m_poly17[d->m_p17] >> 8) & 0xff;
			//LOG_RAND("%s: POKEY rand17[$%05x]: $%02x\n", machine().describe_context(), m_p17, data);
		}
		break;

	case SERIN_C:
		//if (!d->m_serin_r_cb.isnull())
		//	d->m_SERIN = d->m_serin_r_cb(offset);
		data = d->m_SERIN;
		//LOG("%s: POKEY SERIN  $%02x\n", machine().describe_context(), data);
		break;

	case IRQST_C:
		/* IRQST is an active low input port; we keep it active high */
		/* internally to ease the (un-)masking of bits */
		data = d->m_IRQST ^ 0xff;
		//LOG("%s: POKEY IRQST  $%02x\n", machine().describe_context(), data);
		break;

	case SKSTAT_C:
		/* SKSTAT is also an active low input port */
		data = d->m_SKSTAT ^ 0xff;
		//LOG("%s: POKEY SKSTAT $%02x\n", machine().describe_context(), data);
		break;

	default:
		//LOG("%s: POKEY register $%02x\n", machine().describe_context(), offset);
		data = 0xff;
		break;
	}
	return data;
}